

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O3

void __thiscall TasgridWrapper::setHierarchy(TasgridWrapper *this)

{
  pointer *ppdVar1;
  long lVar2;
  bool bVar3;
  pointer pdVar4;
  char cVar5;
  char cVar6;
  undefined8 *puVar7;
  long *plVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  ulong *puVar12;
  size_t sVar13;
  size_t sVar14;
  uint *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  string __str_1;
  string __str;
  Data2D<double> vals;
  pointer *local_168;
  pointer local_158;
  undefined8 uStack_150;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  ulong *local_100;
  uint local_f8;
  undefined4 uStack_f4;
  ulong local_f0 [2];
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  Data2D<double> local_60;
  ulong local_38;
  
  readMatrix(&local_60,this,&this->valsfilename);
  uVar20 = (uint)local_60.num_strips;
  lVar2 = *(long *)&this->field_0x8;
  if (lVar2 == 0) {
    uVar19 = 0;
  }
  else {
    puVar15 = (uint *)(lVar2 + 0x20);
    if (*(long *)(lVar2 + 0x28) == *(long *)(lVar2 + 0x30)) {
      puVar15 = (uint *)(lVar2 + 0x48);
    }
    uVar19 = *puVar15;
  }
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"grid is awaiting ","");
  lVar2 = *(long *)&this->field_0x8;
  if (lVar2 == 0) {
    uVar23 = 0;
  }
  else {
    puVar15 = (uint *)(lVar2 + 0x20);
    if (*(long *)(lVar2 + 0x28) == *(long *)(lVar2 + 0x30)) {
      puVar15 = (uint *)(lVar2 + 0x48);
    }
    uVar23 = *puVar15;
  }
  uVar22 = -uVar23;
  if (0 < (int)uVar23) {
    uVar22 = uVar23;
  }
  uVar21 = 1;
  if (9 < uVar22) {
    uVar16 = (ulong)uVar22;
    uVar10 = 4;
    do {
      uVar21 = uVar10;
      uVar9 = (uint)uVar16;
      if (uVar9 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_00130ea3;
      }
      if (uVar9 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_00130ea3;
      }
      if (uVar9 < 10000) goto LAB_00130ea3;
      uVar16 = uVar16 / 10000;
      uVar10 = uVar21 + 4;
    } while (99999 < uVar9);
    uVar21 = uVar21 + 1;
  }
LAB_00130ea3:
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar21 - (char)((int)uVar23 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar23 >> 0x1f) + (long)local_e0),uVar21,uVar22);
  uVar16 = 0xf;
  if (local_c0 != local_b0) {
    uVar16 = local_b0[0];
  }
  if (uVar16 < (ulong)(local_d8 + local_b8)) {
    uVar16 = 0xf;
    if (local_e0 != local_d0) {
      uVar16 = local_d0[0];
    }
    if (uVar16 < (ulong)(local_d8 + local_b8)) goto LAB_00130f40;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_00130f40:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0);
  }
  local_140 = &local_130;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_130 = *plVar8;
    uStack_128 = puVar7[3];
  }
  else {
    local_130 = *plVar8;
    local_140 = (long *)*puVar7;
  }
  local_138 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  local_80 = &local_70;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_70 = *plVar11;
    lStack_68 = plVar8[3];
  }
  else {
    local_70 = *plVar11;
    local_80 = (long *)*plVar8;
  }
  local_78 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_80,(ulong)(this->valsfilename)._M_dataplus._M_p);
  local_a0 = &local_90;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_90 = *plVar11;
    lStack_88 = plVar8[3];
  }
  else {
    local_90 = *plVar11;
    local_a0 = (long *)*plVar8;
  }
  local_98 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_120 = &local_110;
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_110 = *puVar12;
    lStack_108 = plVar8[3];
  }
  else {
    local_110 = *puVar12;
    local_120 = (ulong *)*plVar8;
  }
  local_118 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar23 = -(uint)local_60.num_strips;
  if (0 < (int)(uint)local_60.num_strips) {
    uVar23 = (uint)local_60.num_strips;
  }
  uVar22 = 1;
  if (9 < uVar23) {
    uVar16 = (ulong)uVar23;
    uVar21 = 4;
    do {
      uVar22 = uVar21;
      uVar10 = (uint)uVar16;
      if (uVar10 < 100) {
        uVar22 = uVar22 - 2;
        goto LAB_0013112b;
      }
      if (uVar10 < 1000) {
        uVar22 = uVar22 - 1;
        goto LAB_0013112b;
      }
      if (uVar10 < 10000) goto LAB_0013112b;
      uVar16 = uVar16 / 10000;
      uVar21 = uVar22 + 4;
    } while (99999 < uVar10);
    uVar22 = uVar22 + 1;
  }
LAB_0013112b:
  local_100 = local_f0;
  std::__cxx11::string::_M_construct
            ((ulong)&local_100,(char)uVar22 - (char)((int)(uint)local_60.num_strips >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)local_60.num_strips >> 0x1f) + (long)local_100),uVar22,uVar23);
  uVar16 = CONCAT44(uStack_f4,local_f8) + local_118;
  uVar17 = 0xf;
  if (local_120 != &local_110) {
    uVar17 = local_110;
  }
  if (uVar17 < uVar16) {
    uVar17 = 0xf;
    if (local_100 != local_f0) {
      uVar17 = local_f0[0];
    }
    if (uVar17 < uVar16) goto LAB_001311bf;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_120);
  }
  else {
LAB_001311bf:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100);
  }
  local_168 = &local_158;
  ppdVar1 = (pointer *)(puVar7 + 2);
  if ((pointer *)*puVar7 == ppdVar1) {
    local_158 = *ppdVar1;
    uStack_150 = puVar7[3];
  }
  else {
    local_158 = *ppdVar1;
    local_168 = (pointer *)*puVar7;
  }
  *puVar7 = ppdVar1;
  puVar7[1] = 0;
  *(undefined1 *)ppdVar1 = 0;
  iassert(this,uVar19 == uVar20,(char *)local_168);
  if (local_168 != &local_158) {
    operator_delete(local_168,(long)local_158 + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if (*(long **)&this->field_0x8 == (long *)0x0) {
LAB_0013136b:
    uVar16 = 0;
LAB_0013136e:
    sVar14 = local_60.stride;
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"grid is set for ","");
    if (*(long *)&this->field_0x8 == 0) {
      uVar20 = 0;
    }
    else {
      uVar20 = *(uint *)(*(long *)&this->field_0x8 + 0x14);
    }
    uVar19 = -uVar20;
    if (0 < (int)uVar20) {
      uVar19 = uVar20;
    }
    uVar23 = 1;
    if (9 < uVar19) {
      uVar17 = (ulong)uVar19;
      uVar22 = 4;
      do {
        uVar23 = uVar22;
        uVar21 = (uint)uVar17;
        if (uVar21 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_001314b8;
        }
        if (uVar21 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_001314b8;
        }
        if (uVar21 < 10000) goto LAB_001314b8;
        uVar17 = uVar17 / 10000;
        uVar22 = uVar23 + 4;
      } while (99999 < uVar21);
      uVar23 = uVar23 + 1;
    }
LAB_001314b8:
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar23 - (char)((int)uVar20 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar20 >> 0x1f) + (long)local_e0),uVar23,uVar19);
    uVar17 = 0xf;
    if (local_c0 != local_b0) {
      uVar17 = local_b0[0];
    }
    if (uVar17 < (ulong)(local_d8 + local_b8)) {
      uVar17 = 0xf;
      if (local_e0 != local_d0) {
        uVar17 = local_d0[0];
      }
      if (uVar17 < (ulong)(local_d8 + local_b8)) goto LAB_00131561;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_00131561:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0);
    }
    local_140 = &local_130;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_130 = *plVar8;
      uStack_128 = puVar7[3];
    }
    else {
      local_130 = *plVar8;
      local_140 = (long *)*puVar7;
    }
    local_138 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_70 = *plVar11;
      lStack_68 = plVar8[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar11;
      local_80 = (long *)*plVar8;
    }
    local_78 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,(ulong)(this->valsfilename)._M_dataplus._M_p);
    local_a0 = &local_90;
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_90 = *plVar11;
      lStack_88 = plVar8[3];
    }
    else {
      local_90 = *plVar11;
      local_a0 = (long *)*plVar8;
    }
    local_98 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
    puVar12 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar12) {
      local_110 = *puVar12;
      lStack_108 = plVar8[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *puVar12;
      local_120 = (ulong *)*plVar8;
    }
    local_118 = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    cVar6 = '\x01';
    if (9 < local_60.stride) {
      sVar13 = local_60.stride;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (sVar13 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_00131748;
        }
        if (sVar13 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_00131748;
        }
        if (sVar13 < 10000) goto LAB_00131748;
        bVar3 = 99999 < sVar13;
        sVar13 = sVar13 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_00131748:
    local_100 = local_f0;
    std::__cxx11::string::_M_construct((ulong)&local_100,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_100,local_f8,local_60.stride);
    uVar17 = CONCAT44(uStack_f4,local_f8) + local_118;
    uVar18 = 0xf;
    if (local_120 != &local_110) {
      uVar18 = local_110;
    }
    if (uVar18 < uVar17) {
      uVar18 = 0xf;
      if (local_100 != local_f0) {
        uVar18 = local_f0[0];
      }
      if (uVar18 < uVar17) goto LAB_001317b9;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_120);
    }
    else {
LAB_001317b9:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100);
    }
    local_168 = &local_158;
    ppdVar1 = (pointer *)(puVar7 + 2);
    if ((pointer *)*puVar7 == ppdVar1) {
      local_158 = *ppdVar1;
      uStack_150 = puVar7[3];
    }
    else {
      local_158 = *ppdVar1;
      local_168 = (pointer *)*puVar7;
    }
    *puVar7 = ppdVar1;
    puVar7[1] = 0;
    *(undefined1 *)ppdVar1 = 0;
    iassert(this,sVar14 == uVar16,(char *)local_168);
    if (local_168 != &local_158) {
      operator_delete(local_168,(long)local_158 + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80 == &local_70) goto LAB_001318c3;
  }
  else {
    cVar6 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
    sVar14 = local_60.stride;
    if (cVar6 == '\0') {
      if (*(long *)&this->field_0x8 == 0) goto LAB_0013136b;
      uVar16 = (ulong)*(int *)(*(long *)&this->field_0x8 + 0x14);
      goto LAB_0013136e;
    }
    if (*(long *)&this->field_0x8 == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = (long)*(int *)(*(long *)&this->field_0x8 + 0x14) * 2;
    }
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"fourier grid is set for ","");
    local_38 = sVar14;
    if (*(long *)&this->field_0x8 == 0) {
      uVar20 = 0;
    }
    else {
      uVar20 = *(uint *)(*(long *)&this->field_0x8 + 0x14);
    }
    uVar19 = -uVar20;
    if (0 < (int)uVar20) {
      uVar19 = uVar20;
    }
    uVar23 = 1;
    if (9 < uVar19) {
      uVar17 = (ulong)uVar19;
      uVar22 = 4;
      do {
        uVar23 = uVar22;
        uVar21 = (uint)uVar17;
        if (uVar21 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_001319ac;
        }
        if (uVar21 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_001319ac;
        }
        if (uVar21 < 10000) goto LAB_001319ac;
        uVar17 = uVar17 / 10000;
        uVar22 = uVar23 + 4;
      } while (99999 < uVar21);
      uVar23 = uVar23 + 1;
    }
LAB_001319ac:
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar23 - (char)((int)uVar20 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar20 >> 0x1f) + (long)local_e0),uVar23,uVar19);
    uVar17 = 0xf;
    if (local_c0 != local_b0) {
      uVar17 = local_b0[0];
    }
    if (uVar17 < (ulong)(local_d8 + local_b8)) {
      uVar17 = 0xf;
      if (local_e0 != local_d0) {
        uVar17 = local_d0[0];
      }
      if (uVar17 < (ulong)(local_d8 + local_b8)) goto LAB_00131a55;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_00131a55:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0);
    }
    local_140 = &local_130;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_130 = *plVar8;
      uStack_128 = puVar7[3];
    }
    else {
      local_130 = *plVar8;
      local_140 = (long *)*puVar7;
    }
    local_138 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_70 = *plVar8;
      lStack_68 = puVar7[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar8;
      local_80 = (long *)*puVar7;
    }
    local_78 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,(ulong)(this->valsfilename)._M_dataplus._M_p);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_90 = *plVar11;
      lStack_88 = plVar8[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar11;
      local_a0 = (long *)*plVar8;
    }
    local_98 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_a0);
    puVar12 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar12) {
      local_110 = *puVar12;
      lStack_108 = plVar8[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *puVar12;
      local_120 = (ulong *)*plVar8;
    }
    local_118 = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    cVar6 = '\x01';
    if (9 < local_60.stride) {
      sVar14 = local_60.stride;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (sVar14 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_00131c36;
        }
        if (sVar14 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_00131c36;
        }
        if (sVar14 < 10000) goto LAB_00131c36;
        bVar3 = 99999 < sVar14;
        sVar14 = sVar14 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_00131c36:
    local_100 = local_f0;
    std::__cxx11::string::_M_construct((ulong)&local_100,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_100,local_f8,local_60.stride);
    uVar17 = CONCAT44(uStack_f4,local_f8) + local_118;
    uVar18 = 0xf;
    if (local_120 != &local_110) {
      uVar18 = local_110;
    }
    if (uVar18 < uVar17) {
      uVar18 = 0xf;
      if (local_100 != local_f0) {
        uVar18 = local_f0[0];
      }
      if (uVar18 < uVar17) goto LAB_00131ca7;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_120);
    }
    else {
LAB_00131ca7:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100);
    }
    local_168 = &local_158;
    ppdVar1 = (pointer *)(puVar7 + 2);
    if ((pointer *)*puVar7 == ppdVar1) {
      local_158 = *ppdVar1;
      uStack_150 = puVar7[3];
    }
    else {
      local_158 = *ppdVar1;
      local_168 = (pointer *)*puVar7;
    }
    *puVar7 = ppdVar1;
    puVar7[1] = 0;
    *(undefined1 *)ppdVar1 = 0;
    iassert(this,local_38 == uVar16,(char *)local_168);
    if (local_168 != &local_158) {
      operator_delete(local_168,(long)local_158 + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_80 == &local_70) goto LAB_001318c3;
  }
  operator_delete(local_80,local_70 + 1);
LAB_001318c3:
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  pdVar4 = local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->pass_flag == true) {
    local_158 = local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    TasGrid::TasmanianSparseGrid::setHierarchicalCoefficients((vector *)this);
    if (pdVar4 != (pointer)0x0) {
      operator_delete(pdVar4,(long)local_158 - (long)pdVar4);
    }
  }
  if (local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TasgridWrapper::setHierarchy(){
    auto vals = readMatrix(valsfilename);
    iassert(vals.getNumStrips() == grid.getNumPoints(),
            (std::string("grid is awaiting ") + std::to_string(grid.getNumPoints()) + " hierarchical surpluses, but "
             + valsfilename + " specifies " + std::to_string(vals.getNumStrips())).c_str());
    if (grid.isFourier())
        iassert((vals.getStride() == (size_t) (2 * grid.getNumOutputs())),
                (std::string("fourier grid is set for ") + std::to_string(grid.getNumOutputs()) + " outputs, but "
                 + valsfilename + " specifies " + std::to_string(vals.getStride())).c_str());
    else
        iassert((vals.getStride() == (size_t) grid.getNumOutputs()),
                (std::string("grid is set for ") + std::to_string(grid.getNumOutputs()) + " outputs, but "
                 + valsfilename + " specifies " + std::to_string(vals.getStride())).c_str());
    if (not pass_flag) return;
    grid.setHierarchicalCoefficients(vals.release());
}